

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::appender::append16
          (appender *this,char16_t cu)

{
  pair<const_char16_t_*,_char32_t> pVar1;
  char16_t surrogates [2];
  char16_t local_c;
  char16_t local_a;
  
  local_c = this->high_surrogate_;
  if ((cu & 0xfc00U) == 0xdc00) {
    if (local_c == L'\0') {
      return false;
    }
    local_a = cu;
    pVar1 = utf::utf16_to_code_point<char16_t_const*,unsigned_short(*)(unsigned_short)>
                      ((utf *)&local_c,(char16_t *)&stack0xfffffffffffffff8,
                       (char16_t *)utf::nop_swapper,
                       (_func_unsigned_short_unsigned_short *)(ulong)(ushort)local_c);
    utf::code_point_to_utf8<char,std::back_insert_iterator<std::__cxx11::string>>
              (pVar1.second,(this->result_).ptr_);
    this->high_surrogate_ = L'\0';
  }
  else if ((cu & 0xfc00U) == 0xd800) {
    if (local_c != L'\0') {
      return false;
    }
    this->high_surrogate_ = cu;
  }
  else {
    if (local_c != L'\0') {
      return false;
    }
    utf::code_point_to_utf8<char,std::back_insert_iterator<std::__cxx11::string>>
              ((uint)(ushort)cu,(this->result_).ptr_);
  }
  return true;
}

Assistant:

bool string_matcher<Callbacks>::appender::append16 (char16_t const cu) {
                bool ok = true;
                if (utf::is_utf16_high_surrogate (cu)) {
                    if (!this->has_high_surrogate ()) {
                        high_surrogate_ = cu;
                    } else {
                        // A high surrogate following another high surrogate.
                        ok = false;
                    }
                } else if (utf::is_utf16_low_surrogate (cu)) {
                    if (!this->has_high_surrogate ()) {
                        // A low surrogate following by something other than a high surrogate.
                        ok = false;
                    } else {
                        char16_t const surrogates[] = {high_surrogate_, cu};
                        auto first = std::begin (surrogates);
                        auto const last = std::end (surrogates);
                        auto code_point = char32_t{0};
                        std::tie (first, code_point) =
                            utf::utf16_to_code_point (first, last, utf::nop_swapper);
                        utf::code_point_to_utf8 (code_point, std::back_inserter (*result_));
                        high_surrogate_ = 0;
                    }
                } else {
                    if (this->has_high_surrogate ()) {
                        // A high surrogate followed by something other than a low surrogate.
                        ok = false;
                    } else {
                        auto const code_point = static_cast<char32_t> (cu);
                        utf::code_point_to_utf8 (code_point, std::back_inserter (*result_));
                    }
                }
                return ok;
            }